

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O3

void __thiscall
vkt::rasterization::anon_unknown_0::LinesTestInstance::generateLines
          (LinesTestInstance *this,int iteration,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *outData,
          vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
          *outLines)

{
  ostringstream *poVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  pointer pVVar12;
  pointer pSVar13;
  ulong uVar14;
  undefined8 uVar15;
  long lVar16;
  long lVar17;
  float extraout_XMM0_Da;
  undefined1 local_1b0 [384];
  
  uVar14 = (ulong)(uint)iteration;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(outData,6);
  if ((uint)iteration < 3) {
    fVar2 = *(float *)(&DAT_00b51584 + uVar14 * 4);
    fVar3 = *(float *)(&DAT_00b51590 + uVar14 * 4);
    fVar4 = *(float *)(&DAT_00b515d8 + uVar14 * 4);
    fVar5 = *(float *)(&DAT_00b5159c + uVar14 * 4);
    fVar6 = *(float *)(&DAT_00b515f0 + uVar14 * 4);
    fVar7 = *(float *)(&DAT_00b51548 + uVar14 * 4);
    fVar8 = *(float *)(&DAT_00b51554 + uVar14 * 4);
    fVar9 = *(float *)(&DAT_00b51614 + uVar14 * 4);
    fVar10 = *(float *)(&DAT_00b51560 + uVar14 * 4);
    fVar11 = *(float *)(&DAT_00b5156c + uVar14 * 4);
    pVVar12 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar12->m_data[0] = *(float *)(&DAT_00b51578 + uVar14 * 4);
    pVVar12->m_data[1] = fVar2;
    pVVar12->m_data[2] = 0.0;
    pVVar12->m_data[3] = 1.0;
    pVVar12 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar12[1].m_data[0] = fVar3;
    pVVar12[1].m_data[1] = fVar4;
    pVVar12[1].m_data[2] = 0.0;
    pVVar12[1].m_data[3] = 1.0;
    pVVar12 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar12[2].m_data[0] = fVar5;
    pVVar12[2].m_data[1] = fVar6;
    pVVar12[2].m_data[2] = 0.0;
    pVVar12[2].m_data[3] = 1.0;
    pVVar12 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar12[3].m_data[0] = fVar7;
    pVVar12[3].m_data[1] = 0.2;
    pVVar12[3].m_data[2] = 0.0;
    pVVar12[3].m_data[3] = 1.0;
    pVVar12 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar12[4].m_data[0] = fVar8;
    pVVar12[4].m_data[1] = fVar9;
    pVVar12[4].m_data[2] = 0.0;
    pVVar12[4].m_data[3] = 1.0;
    pVVar12 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar12[5].m_data[0] = fVar10;
    pVVar12[5].m_data[1] = fVar11;
    pVVar12[5].m_data[2] = 0.0;
    pVVar12[5].m_data[3] = 1.0;
  }
  std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::resize
            (outLines,3);
  pVVar12 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pSVar13 = (outLines->
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar15 = *(undefined8 *)(pVVar12->m_data + 2);
  *(undefined8 *)pSVar13->positions[0].m_data = *(undefined8 *)pVVar12->m_data;
  *(undefined8 *)(pSVar13->positions[0].m_data + 2) = uVar15;
  pVVar12 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pSVar13 = (outLines->
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar15 = *(undefined8 *)(pVVar12[1].m_data + 2);
  *(undefined8 *)pSVar13->positions[1].m_data = *(undefined8 *)pVVar12[1].m_data;
  *(undefined8 *)(pSVar13->positions[1].m_data + 2) = uVar15;
  pVVar12 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pSVar13 = (outLines->
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar15 = *(undefined8 *)(pVVar12[2].m_data + 2);
  *(undefined8 *)pSVar13[1].positions[0].m_data = *(undefined8 *)pVVar12[2].m_data;
  *(undefined8 *)(pSVar13[1].positions[0].m_data + 2) = uVar15;
  pVVar12 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pSVar13 = (outLines->
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar15 = *(undefined8 *)(pVVar12[3].m_data + 2);
  *(undefined8 *)pSVar13[1].positions[1].m_data = *(undefined8 *)pVVar12[3].m_data;
  *(undefined8 *)(pSVar13[1].positions[1].m_data + 2) = uVar15;
  pVVar12 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pSVar13 = (outLines->
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar15 = *(undefined8 *)(pVVar12[4].m_data + 2);
  *(undefined8 *)pSVar13[2].positions[0].m_data = *(undefined8 *)pVVar12[4].m_data;
  *(undefined8 *)(pSVar13[2].positions[0].m_data + 2) = uVar15;
  pVVar12 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pSVar13 = (outLines->
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar15 = *(undefined8 *)(pVVar12[5].m_data + 2);
  *(undefined8 *)pSVar13[2].positions[1].m_data = *(undefined8 *)pVVar12[5].m_data;
  *(undefined8 *)(pSVar13[2].positions[1].m_data + 2) = uVar15;
  local_1b0._0_8_ =
       ((this->super_BaseLineTestInstance).super_BaseRenderingTestInstance.super_TestInstance.
       m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Rendering ",10);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," lines(s): (width = ",0x14);
  (*(this->super_BaseLineTestInstance).super_BaseRenderingTestInstance.super_TestInstance.
    _vptr_TestInstance[3])();
  std::ostream::_M_insert<double>((double)extraout_XMM0_Da);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  if (0 < (int)((ulong)((long)(outLines->
                              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(outLines->
                             super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    lVar16 = 0;
    lVar17 = 0;
    do {
      local_1b0._0_8_ =
           ((this->super_BaseLineTestInstance).super_BaseRenderingTestInstance.super_TestInstance.
           m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Line ",5);
      lVar17 = lVar17 + 1;
      std::ostream::operator<<(poVar1,(int)lVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n\t",2);
      tcu::operator<<((ostream *)poVar1,
                      (Vector<float,_4> *)
                      ((long)((outLines->
                              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                              )._M_impl.super__Vector_impl_data._M_start)->positions[0].m_data +
                      lVar16));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n\t",2);
      tcu::operator<<((ostream *)poVar1,
                      (Vector<float,_4> *)
                      ((long)((outLines->
                              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                              )._M_impl.super__Vector_impl_data._M_start)->positions[1].m_data +
                      lVar16));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      lVar16 = lVar16 + 0x40;
    } while (lVar17 < (int)((ulong)((long)(outLines->
                                          super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(outLines->
                                         super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 6));
  }
  return;
}

Assistant:

void LinesTestInstance::generateLines (int iteration, std::vector<tcu::Vec4>& outData, std::vector<LineSceneSpec::SceneLine>& outLines)
{
	outData.resize(6);

	switch (iteration)
	{
		case 0:
			// \note: these values are chosen arbitrarily
			outData[0] = tcu::Vec4( 0.01f,  0.0f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4( 0.5f,   0.2f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4( 0.46f,  0.3f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(-0.3f,   0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4(-1.5f,  -0.4f, 0.0f, 1.0f);
			outData[5] = tcu::Vec4( 0.1f,   0.5f, 0.0f, 1.0f);
			break;

		case 1:
			outData[0] = tcu::Vec4(-0.499f, 0.128f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4(-0.501f,  -0.3f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4(  0.11f,  -0.2f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(  0.11f,   0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4(  0.88f,   0.9f, 0.0f, 1.0f);
			outData[5] = tcu::Vec4(  0.18f,  -0.2f, 0.0f, 1.0f);
			break;

		case 2:
			outData[0] = tcu::Vec4( -0.9f, -0.3f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4(  1.1f, -0.9f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4(  0.7f, -0.1f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4( 0.11f,  0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4( 0.88f,  0.7f, 0.0f, 1.0f);
			outData[5] = tcu::Vec4(  0.8f, -0.7f, 0.0f, 1.0f);
			break;
	}

	outLines.resize(3);
	outLines[0].positions[0] = outData[0];
	outLines[0].positions[1] = outData[1];
	outLines[1].positions[0] = outData[2];
	outLines[1].positions[1] = outData[3];
	outLines[2].positions[0] = outData[4];
	outLines[2].positions[1] = outData[5];

	// log
	m_context.getTestContext().getLog() << tcu::TestLog::Message << "Rendering " << outLines.size() << " lines(s): (width = " << getLineWidth() << ")" << tcu::TestLog::EndMessage;
	for (int lineNdx = 0; lineNdx < (int)outLines.size(); ++lineNdx)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Line " << (lineNdx+1) << ":"
			<< "\n\t" << outLines[lineNdx].positions[0]
			<< "\n\t" << outLines[lineNdx].positions[1]
			<< tcu::TestLog::EndMessage;
	}
}